

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::drawTearOff(QMenuPrivate *this,QPainter *painter,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidget *widget;
  int iVar5;
  QStyle *pQVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QStyleOptionMenuItem menuOpt;
  QStyleOptionMenuItem QStack_c8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((painter != (QPainter *)0x0) &&
      (uVar1 = rect->x1, uVar3 = rect->y1, uVar2 = rect->x2, uVar4 = rect->y2,
      auVar7._0_4_ = -(uint)((int)uVar2 < (int)uVar1), auVar7._4_4_ = auVar7._0_4_,
      auVar7._8_4_ = -(uint)((int)uVar4 < (int)uVar3),
      auVar7._12_4_ = -(uint)((int)uVar4 < (int)uVar3), iVar5 = movmskpd((int)local_30,auVar7),
      iVar5 == 0)) && ((this->field_0x421 & 2) != 0)) {
    widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&QStack_c8,0xaa,0x98);
    QStyleOptionMenuItem::QStyleOptionMenuItem(&QStack_c8);
    QStyleOption::initFrom(&QStack_c8.super_QStyleOption,widget);
    QStack_c8.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
    QStack_c8.checkType = NotCheckable;
    QStack_c8.maxIconWidth = 0;
    QStack_c8.reservedShortcutWidth = 0;
    QStack_c8.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
    QStack_c8.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
    QStack_c8.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
    QStack_c8.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
    QStack_c8.menuItemType = TearOff;
    if ((this->field_0x421 & 8) != 0) {
      QStack_c8.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x8000;
    }
    QPainter::setClipRect((QRect *)painter,(int)&QStack_c8 + 0x10);
    pQVar6 = QWidget::style(widget);
    (**(code **)(*(long *)pQVar6 + 0xb8))(pQVar6,0x12,&QStack_c8,painter,widget);
    QFont::~QFont(&QStack_c8.font);
    QIcon::~QIcon(&QStack_c8.icon);
    if (&(QStack_c8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_c8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_c8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((QStack_c8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(QStack_c8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStyleOption::~QStyleOption(&QStack_c8.super_QStyleOption);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::drawTearOff(QPainter *painter, const QRect &rect)
{
    if (!painter || rect.isEmpty())
        return;

    if (!tearoff)
        return;

    Q_Q(QMenu);
    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(q);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    menuOpt.rect = rect;
    menuOpt.menuItemType = QStyleOptionMenuItem::TearOff;
    if (tearoffHighlighted)
        menuOpt.state |= QStyle::State_Selected;

    painter->setClipRect(menuOpt.rect);
    q->style()->drawControl(QStyle::CE_MenuTearoff, &menuOpt, painter, q);
}